

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

lzham_compress_status_t
lzham::lzham_lib_compress
          (lzham_compress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  bool bVar1;
  lzham_compress_status_t lVar2;
  ulong uVar3;
  ulong uVar4;
  lzham_compress_state *pState;
  
  if (p == (lzham_compress_state_ptr)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (*(int *)((long)p + 0x5a26e0) == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pOut_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pIn_buf_size == (size_t *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (1 < *(uint *)((long)p + 0x5a26f8)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if ((pIn_buf == (lzham_uint8 *)0x0) && (*pIn_buf_size != 0)) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pOut_buf == (lzham_uint8 *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (*pOut_buf_size == 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  uVar3 = (ulong)*(uint *)((long)p + 0x3b30);
  if (*(ulong *)((long)p + 0x5a26d0) < uVar3) {
    *pIn_buf_size = 0;
    uVar3 = uVar3 - *(long *)((long)p + 0x5a26d0);
    if (*pOut_buf_size <= uVar3) {
      uVar3 = *pOut_buf_size;
    }
    *pOut_buf_size = uVar3;
    memcpy(pOut_buf,(void *)(*(long *)((long)p + 0x3b28) + *(long *)((long)p + 0x5a26d0)),uVar3);
    *(long *)((long)p + 0x5a26d0) = *(long *)((long)p + 0x5a26d0) + *pOut_buf_size;
    *(undefined4 *)((long)p + 0x5a26f8) = 0;
    return LZHAM_COMP_STATUS_NOT_FINISHED;
  }
  if (uVar3 != 0) {
    *(undefined4 *)((long)p + 0x3b30) = 0;
  }
  *(undefined8 *)((long)p + 0x5a26d0) = 0;
  uVar3 = *pIn_buf_size;
  if (*(char *)((long)p + 0x5a26d8) == '\x01') {
    if (no_more_input_bytes_flag != 0 && uVar3 == 0) {
      *pIn_buf_size = 0;
      *pOut_buf_size = 0;
      *(undefined4 *)((long)p + 0x5a26f8) = 2;
      return LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
    }
    *(undefined4 *)((long)p + 0x5a26f8) = 5;
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  uVar4 = 0x400000;
  if (uVar3 < 0x400000) {
    uVar4 = uVar3;
  }
  if ((uVar3 == 0) ||
     (bVar1 = lzcompressor::put_bytes((lzcompressor *)((long)p + 0x2c8),pIn_buf,(uint)uVar4), bVar1)
     ) {
    if ((no_more_input_bytes_flag != 0 && uVar3 < 0x400001) &&
       (*(char *)((long)p + 0x5a26d8) == '\0')) {
      bVar1 = lzcompressor::put_bytes((lzcompressor *)((long)p + 0x2c8),(void *)0x0,0);
      if (!bVar1) goto LAB_0010a968;
      *(undefined1 *)((long)p + 0x5a26d8) = 1;
    }
    *pIn_buf_size = uVar4;
    uVar4 = (ulong)*(uint *)((long)p + 0x3b30) - *(long *)((long)p + 0x5a26d0);
    if (*pOut_buf_size <= uVar4) {
      uVar4 = *pOut_buf_size;
    }
    *pOut_buf_size = uVar4;
    if (uVar4 != 0) {
      memcpy(pOut_buf,(void *)(*(long *)((long)p + 0x3b28) + *(long *)((long)p + 0x5a26d0)),uVar4);
      *(long *)((long)p + 0x5a26d0) = *(long *)((long)p + 0x5a26d0) + *pOut_buf_size;
    }
    if ((((no_more_input_bytes_flag == 0) || (*(char *)((long)p + 0x5a26d8) != '\x01')) ||
        (lVar2 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE,
        *(ulong *)((long)p + 0x5a26d0) < (ulong)*(uint *)((long)p + 0x3b30))) &&
       ((0x400000 < uVar3 || no_more_input_bytes_flag != 0 ||
        (lVar2 = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT,
        *(ulong *)((long)p + 0x5a26d0) < (ulong)*(uint *)((long)p + 0x3b30))))) {
      lVar2 = LZHAM_COMP_STATUS_NOT_FINISHED;
    }
    *(lzham_compress_status_t *)((long)p + 0x5a26f8) = lVar2;
  }
  else {
LAB_0010a968:
    *pIn_buf_size = 0;
    *pOut_buf_size = 0;
    *(undefined4 *)((long)p + 0x5a26f8) = 3;
    lVar2 = LZHAM_COMP_STATUS_FAILED;
  }
  return lVar2;
}

Assistant:

lzham_compress_status_t lzham_lib_compress(
      lzham_compress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size, 
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_compress_state *pState = static_cast<lzham_compress_state*>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (pState->m_status >= LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      if ((!*pOut_buf_size) || (!pOut_buf))
      {
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      
      byte_vec &comp_data = pState->m_compressor.get_compressed_data();
      if (pState->m_comp_data_ofs < comp_data.size())
      {
         *pIn_buf_size = 0;
         *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);
                  
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);
         
         pState->m_comp_data_ofs += *pOut_buf_size;
         
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
         return pState->m_status;
      }
      
      comp_data.try_resize(0);
      pState->m_comp_data_ofs = 0;
      
      if (pState->m_flushed_compressor)
      {
         if ((*pIn_buf_size) || (!no_more_input_bytes_flag))
         {
            pState->m_status = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            return pState->m_status;
         }
         
         *pIn_buf_size = 0;
         *pOut_buf_size = 0;
         
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
         return pState->m_status;
      }
      
      const size_t cMaxBytesToPutPerIteration = 4*1024*1024;
      size_t bytes_to_put = LZHAM_MIN(cMaxBytesToPutPerIteration, *pIn_buf_size);
      const bool consumed_entire_input_buf = (bytes_to_put == *pIn_buf_size);

      if (bytes_to_put)
      {
         if (!pState->m_compressor.put_bytes(pIn_buf, (uint)bytes_to_put))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;
            
            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }
      }
      
      if ((consumed_entire_input_buf) && (no_more_input_bytes_flag) && (!pState->m_flushed_compressor))
      {
         if (!pState->m_compressor.put_bytes(NULL, 0))
         {
            *pIn_buf_size = 0;
            *pOut_buf_size = 0;

            pState->m_status = LZHAM_COMP_STATUS_FAILED;
            return pState->m_status;
         }  
         pState->m_flushed_compressor = true;  
      }
                  
      *pIn_buf_size = bytes_to_put;
      
      *pOut_buf_size = LZHAM_MIN(comp_data.size() - pState->m_comp_data_ofs, *pOut_buf_size);   
      if (*pOut_buf_size)
      {
         memcpy(pOut_buf, comp_data.get_ptr() + pState->m_comp_data_ofs, *pOut_buf_size);

         pState->m_comp_data_ofs += *pOut_buf_size;
      }
      
      if ((no_more_input_bytes_flag) && (pState->m_flushed_compressor) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_SUCCESS;
      else if ((consumed_entire_input_buf) && (!no_more_input_bytes_flag) && (pState->m_comp_data_ofs >= comp_data.size()))
         pState->m_status = LZHAM_COMP_STATUS_NEEDS_MORE_INPUT;
      else
         pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      
      return pState->m_status;  
   }